

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal.h
# Opt level: O2

uint * generating_polynomial(uint t,uint *len)

{
  uint *puVar1;
  uint uVar2;
  
  if (t == 2) {
    uVar2 = 5;
    puVar1 = vector_new(5);
    puVar1[0] = 0x74;
    puVar1[1] = 0xe7;
    puVar1[2] = 0xd8;
    puVar1[3] = 0x1e;
    puVar1[4] = 1;
  }
  else {
    if (t != 1) {
      return (uint *)0x0;
    }
    uVar2 = 2;
    puVar1 = vector_new(2);
    puVar1[0] = 2;
    puVar1[1] = 1;
  }
  if (len != (uint *)0x0) {
    *len = uVar2;
  }
  return puVar1;
}

Assistant:

uint32_t *generating_polynomial(uint32_t t, uint32_t *len)
{
    if(t == 1){
        uint32_t *v = vector_new(2);
        v[0] = 2;
        v[1] = 1;
        if(len != NULL)
            *len = 2;
        return v;
    }
    else if(t == 2){
        uint32_t *v = vector_new(5);
        v[0] = 116;
        v[1] = 231;
        v[2] = 216;
        v[3] = 30;
        v[4] = 1;
        if(len != NULL)
           *len = 5;
        return v;
    }
    else{
        return NULL;
    }
    /* TODO: fix bug
    uint32_t glen = 2;
    uint32_t *g = vector_new(glen);
    g[0] = alpha_of[1]; // =2
    g[1] = alpha_of[0]; // =1

    if (t >= 2)
    {
        for (uint32_t i = 2; i <= 2 * t; i++)
        {
            uint32_t *g1 = vector_copy(g, glen);
            for (uint32_t j = 0; j < glen; j++)
                g1[j] = gf_mul(g1[j], alpha_of[i]);

            // TODO: this can be more effective
            // g = [[0] + g]
            uint32_t *z = vector_new(1);
            uint32_t *g0 = stack(z, 1, g, glen, &glen);
            vector_free(z);
            vector_free(g);
            g = g0;
            if (len != NULL)
                *len = glen;

            for (uint32_t j = 0; j < glen; j++)
                g[j] = gf_sum(g0[j], g1[j]);
        }
        return g;
    }
    else
    {
        if (len != NULL)
            *len = glen;
        return g;
    }
    */
}